

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O2

RGBA tcu::operator+(RGBA *a,RGBA *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = a->m_value;
  uVar1 = b->m_value;
  uVar4 = (uVar1 & 0xff) + (uVar3 & 0xff);
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  uVar5 = (uVar1 >> 8 & 0xff) + (uVar3 >> 8 & 0xff);
  if (0xfe < uVar5) {
    uVar5 = 0xff;
  }
  uVar2 = (uVar1 >> 0x10 & 0xff) + (uVar3 >> 0x10 & 0xff);
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  uVar3 = (uVar1 >> 0x18) + (uVar3 >> 0x18);
  if (0xfe < uVar3) {
    uVar3 = 0xff;
  }
  return (RGBA)(uVar2 << 0x10 | uVar3 << 0x18 | uVar5 << 8 | uVar4);
}

Assistant:

int			getBlue					(void) const { return (int)((m_value >> (deUint32)BLUE_SHIFT)  & 0xFFu); }